

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_utils_basis.h
# Opt level: O0

void __thiscall
ktx::OptionsEncodeBasis<false>::process
          (OptionsEncodeBasis<false> *this,Options *param_2,ParseResult *args,Reporter *report)

{
  BasisCodec BVar1;
  uint uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  OptionValue *pOVar4;
  size_t sVar5;
  uint *puVar6;
  OptionValue *this_00;
  OptionsEncodeBasis<false> *this_01;
  char *name;
  ParseResult *in_RDX;
  long in_RDI;
  float fVar7;
  uint32_t level;
  string codec_option;
  Reporter *in_stack_fffffffffffff9b8;
  OptionsEncodeBasis<false> *in_stack_fffffffffffff9c0;
  Reporter *in_stack_fffffffffffff9c8;
  OptionsEncodeBasis<false> *in_stack_fffffffffffff9d0;
  OptionsEncodeBasis<false> *pOVar8;
  string *in_stack_fffffffffffff9e8;
  ParseResult *in_stack_fffffffffffff9f0;
  ParseResult *pPVar9;
  char *in_stack_fffffffffffff9f8;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa00;
  OptionValue *in_stack_fffffffffffffa10;
  OptionsEncodeBasis<false> *in_stack_fffffffffffffa18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa28;
  char (*in_stack_fffffffffffffa30) [28];
  undefined4 in_stack_fffffffffffffa38;
  undefined4 in_stack_fffffffffffffa3c;
  char *in_stack_fffffffffffffa78;
  ParseResult *in_stack_fffffffffffffa80;
  OptionsEncodeBasis<false> *in_stack_fffffffffffffa88;
  OptionValue *in_stack_fffffffffffffaf0;
  undefined4 in_stack_fffffffffffffaf8;
  undefined4 in_stack_fffffffffffffafc;
  allocator<char> local_319;
  string local_318 [39];
  undefined1 local_2f1 [40];
  allocator<char> local_2c9;
  string local_2c8 [39];
  allocator<char> local_2a1;
  string local_2a0 [39];
  allocator<char> local_279;
  string local_278 [39];
  allocator<char> local_251;
  string local_250 [39];
  allocator<char> local_229;
  string local_228 [32];
  uint local_208 [3];
  allocator<char> local_1f9;
  string local_1f8 [39];
  allocator<char> local_1d1;
  string local_1d0 [39];
  allocator<char> local_1a9;
  string local_1a8 [39];
  allocator<char> local_181;
  string local_180 [39];
  allocator<char> local_159;
  string local_158 [39];
  allocator<char> local_131;
  string local_130 [39];
  allocator<char> local_109;
  string local_108 [39];
  allocator<char> local_e1;
  string local_e0 [39];
  allocator<char> local_b9;
  string local_b8 [32];
  string local_98 [32];
  string local_78 [55];
  allocator<char> local_41;
  string local_40 [40];
  ParseResult *local_18;
  
  local_18 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,
             (allocator<char> *)in_stack_fffffffffffff9f0);
  std::allocator<char>::~allocator(&local_41);
  cxxopts::ParseResult::operator[](in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  BVar1 = validateBasisCodec((OptionsEncodeBasis<false> *)
                             CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                             in_stack_fffffffffffffaf0);
  *(BasisCodec *)(in_RDI + 0x100) = BVar1;
  if (*(int *)(in_RDI + 0x100) != 0) {
    if (*(int *)(in_RDI + 0x100) - 1U < 2) {
      cxxopts::ParseResult::operator[](in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
      pbVar3 = cxxopts::OptionValue::as<std::__cxx11::string>(in_stack_fffffffffffffa10);
      std::__cxx11::string::string(local_98,(string *)pbVar3);
      to_lower_copy(&in_stack_fffffffffffff9c8->commandName);
      std::__cxx11::string::operator=((string *)(in_RDI + 0xe0),local_78);
      std::__cxx11::string::~string(local_78);
      std::__cxx11::string::~string(local_98);
    }
    else {
      cxxopts::ParseResult::operator[](in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
      cxxopts::OptionValue::as<std::__cxx11::string>(in_stack_fffffffffffffa10);
      Reporter::fatal_usage<char_const(&)[28],std::__cxx11::string_const&>
                ((Reporter *)CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38),
                 in_stack_fffffffffffffa30,in_stack_fffffffffffffa28);
    }
  }
  if (*(int *)(in_RDI + 0x100) == 2) {
    *(undefined1 *)(in_RDI + 4) = 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,
             (allocator<char> *)in_stack_fffffffffffff9f0);
  pOVar4 = cxxopts::ParseResult::operator[](in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  sVar5 = cxxopts::OptionValue::count(pOVar4);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator(&local_b9);
  if (sVar5 != 0) {
    validateBasisLZArg(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,(char *)0x217fda);
    uVar2 = captureCodecOption<unsigned_int>
                      (in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,in_stack_fffffffffffffa78
                      );
    *(uint *)(in_RDI + 0xc) = uVar2;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,
             (allocator<char> *)in_stack_fffffffffffff9f0);
  pOVar4 = cxxopts::ParseResult::operator[](in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  sVar5 = cxxopts::OptionValue::count(pOVar4);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator(&local_e1);
  if (sVar5 != 0) {
    validateBasisLZArg(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,(char *)0x21812d);
    captureCodecOption<unsigned_int>
              (in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
    ClampedOption<unsigned_int>::operator=
              ((ClampedOption<unsigned_int> *)in_stack_fffffffffffff9c0,
               (uint)((ulong)in_stack_fffffffffffff9b8 >> 0x20));
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,
             (allocator<char> *)in_stack_fffffffffffff9f0);
  pOVar4 = cxxopts::ParseResult::operator[](in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  sVar5 = cxxopts::OptionValue::count(pOVar4);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator(&local_109);
  if (sVar5 != 0) {
    validateBasisLZArg(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,(char *)0x218288);
    captureCodecOption(in_stack_fffffffffffffa18,(char *)in_stack_fffffffffffffa10);
    *(undefined1 *)(in_RDI + 0x2b) = 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,
             (allocator<char> *)in_stack_fffffffffffff9f0);
  pOVar4 = cxxopts::ParseResult::operator[](in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  sVar5 = cxxopts::OptionValue::count(pOVar4);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator(&local_131);
  if (sVar5 != 0) {
    validateBasisLZArg(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,(char *)0x2183c6);
    captureCodecOption(in_stack_fffffffffffffa18,(char *)in_stack_fffffffffffffa10);
    *(undefined1 *)(in_RDI + 0x2c) = 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,
             (allocator<char> *)in_stack_fffffffffffff9f0);
  pOVar4 = cxxopts::ParseResult::operator[](in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  sVar5 = cxxopts::OptionValue::count(pOVar4);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator(&local_159);
  if (sVar5 != 0) {
    validateBasisLZEndpointRDOArg
              (in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8,(char *)in_stack_fffffffffffff9c0
              );
    captureCodecOption<unsigned_int>
              (in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
    ClampedOption<unsigned_int>::operator=
              ((ClampedOption<unsigned_int> *)in_stack_fffffffffffff9c0,
               (uint)((ulong)in_stack_fffffffffffff9b8 >> 0x20));
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,
             (allocator<char> *)in_stack_fffffffffffff9f0);
  pOVar4 = cxxopts::ParseResult::operator[](in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  sVar5 = cxxopts::OptionValue::count(pOVar4);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator(&local_181);
  if (sVar5 != 0) {
    validateBasisLZEndpointRDOArg
              (in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8,(char *)in_stack_fffffffffffff9c0
              );
    fVar7 = captureCodecOption<float>
                      (in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,in_stack_fffffffffffffa78
                      );
    *(float *)(in_RDI + 0x18) = fVar7;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,
             (allocator<char> *)in_stack_fffffffffffff9f0);
  pOVar4 = cxxopts::ParseResult::operator[](in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  sVar5 = cxxopts::OptionValue::count(pOVar4);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  if (sVar5 != 0) {
    validateBasisLZSelectorRDOArg
              (in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8,(char *)in_stack_fffffffffffff9c0
              );
    captureCodecOption<unsigned_int>
              (in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
    ClampedOption<unsigned_int>::operator=
              ((ClampedOption<unsigned_int> *)in_stack_fffffffffffff9c0,
               (uint)((ulong)in_stack_fffffffffffff9b8 >> 0x20));
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,
             (allocator<char> *)in_stack_fffffffffffff9f0);
  pOVar4 = cxxopts::ParseResult::operator[](in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  sVar5 = cxxopts::OptionValue::count(pOVar4);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  if (sVar5 != 0) {
    validateBasisLZSelectorRDOArg
              (in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8,(char *)in_stack_fffffffffffff9c0
              );
    fVar7 = captureCodecOption<float>
                      (in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,in_stack_fffffffffffffa78
                      );
    *(float *)(in_RDI + 0x20) = fVar7;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,
             (allocator<char> *)in_stack_fffffffffffff9f0);
  pOVar4 = cxxopts::ParseResult::operator[](in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  sVar5 = cxxopts::OptionValue::count(pOVar4);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  if (sVar5 != 0) {
    validateUASTCArg(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,(char *)0x218a6c);
    local_208[2] = captureCodecOption<unsigned_int>
                             (in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,
                              in_stack_fffffffffffffa78);
    local_208[1] = 0;
    local_208[0] = 4;
    puVar6 = std::clamp<unsigned_int>(local_208 + 2,local_208 + 1,local_208);
    local_208[2] = *puVar6;
    *(undefined4 *)(in_RDI + 0x30) = 0xfffffff0;
    *(uint *)(in_RDI + 0x30) = local_208[2] | *(uint *)(in_RDI + 0x30);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,
             (allocator<char> *)in_stack_fffffffffffff9f0);
  pOVar4 = cxxopts::ParseResult::operator[](in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  sVar5 = cxxopts::OptionValue::count(pOVar4);
  std::__cxx11::string::~string(local_228);
  std::allocator<char>::~allocator(&local_229);
  if (sVar5 != 0) {
    validateUASTCArg(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,(char *)0x218c25);
    captureCodecOption(in_stack_fffffffffffffa18,(char *)in_stack_fffffffffffffa10);
    *(undefined1 *)(in_RDI + 0x34) = 1;
  }
  fVar7 = (float)((ulong)in_stack_fffffffffffff9b8 >> 0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,
             (allocator<char> *)in_stack_fffffffffffff9f0);
  pOVar4 = cxxopts::ParseResult::operator[](in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  sVar5 = cxxopts::OptionValue::count(pOVar4);
  std::__cxx11::string::~string(local_250);
  std::allocator<char>::~allocator(&local_251);
  if (sVar5 != 0) {
    validateUASTCRDOArg(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8,
                        (char *)in_stack_fffffffffffff9c0);
    captureCodecOption<float>
              (in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
    ClampedOption<float>::operator=((ClampedOption<float> *)in_stack_fffffffffffff9c0,fVar7);
  }
  pPVar9 = local_18;
  pOVar8 = (OptionsEncodeBasis<false> *)kUastcRdoD;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,
             (allocator<char> *)in_stack_fffffffffffff9f0);
  pOVar4 = cxxopts::ParseResult::operator[](in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  sVar5 = cxxopts::OptionValue::count(pOVar4);
  std::__cxx11::string::~string(local_278);
  std::allocator<char>::~allocator(&local_279);
  if (sVar5 != 0) {
    validateUASTCRDOArg(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8,
                        (char *)in_stack_fffffffffffff9c0);
    captureCodecOption<unsigned_int>(pOVar8,pPVar9,(char *)pOVar4);
    ClampedOption<unsigned_int>::operator=
              ((ClampedOption<unsigned_int> *)in_stack_fffffffffffff9c0,(uint)fVar7);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,
             (allocator<char> *)in_stack_fffffffffffff9f0);
  this_00 = cxxopts::ParseResult::operator[](in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  sVar5 = cxxopts::OptionValue::count(this_00);
  std::__cxx11::string::~string(local_2a0);
  std::allocator<char>::~allocator(&local_2a1);
  if (sVar5 != 0) {
    validateUASTCRDOArg(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8,
                        (char *)in_stack_fffffffffffff9c0);
    captureCodecOption<float>(pOVar8,pPVar9,(char *)pOVar4);
    ClampedOption<float>::operator=((ClampedOption<float> *)in_stack_fffffffffffff9c0,fVar7);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,
             (allocator<char> *)in_stack_fffffffffffff9f0);
  this_01 = (OptionsEncodeBasis<false> *)
            cxxopts::ParseResult::operator[](in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  name = (char *)cxxopts::OptionValue::count((OptionValue *)this_01);
  std::__cxx11::string::~string(local_2c8);
  std::allocator<char>::~allocator(&local_2c9);
  if (name != (char *)0x0) {
    validateUASTCRDOArg(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8,
                        (char *)in_stack_fffffffffffff9c0);
    captureCodecOption<float>(pOVar8,pPVar9,(char *)pOVar4);
    ClampedOption<float>::operator=((ClampedOption<float> *)in_stack_fffffffffffff9c0,fVar7);
  }
  pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f1;
  pPVar9 = local_18;
  __s = kUastcRdoF;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(pbVar3,__s,(allocator<char> *)pPVar9);
  pOVar4 = cxxopts::ParseResult::operator[](pPVar9,in_stack_fffffffffffff9e8);
  sVar5 = cxxopts::OptionValue::count(pOVar4);
  std::__cxx11::string::~string((string *)(local_2f1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_2f1);
  if (sVar5 != 0) {
    validateUASTCRDOArg(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8,
                        (char *)in_stack_fffffffffffff9c0);
    captureCodecOption(this_01,name);
    *(undefined1 *)(in_RDI + 0x48) = 1;
  }
  pOVar8 = (OptionsEncodeBasis<false> *)kUastcRdoM;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(pbVar3,__s,(allocator<char> *)pPVar9);
  pOVar4 = cxxopts::ParseResult::operator[](pPVar9,(string *)pOVar4);
  sVar5 = cxxopts::OptionValue::count(pOVar4);
  std::__cxx11::string::~string(local_318);
  std::allocator<char>::~allocator(&local_319);
  if (sVar5 != 0) {
    validateUASTCRDOArg(pOVar8,(Reporter *)local_18,(char *)pOVar4);
    captureCodecOption(this_01,name);
    *(undefined1 *)(in_RDI + 0x49) = 1;
  }
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void process(cxxopts::Options&, cxxopts::ParseResult& args, Reporter& report) {
        std::string codec_option{"encode"};

        if (ENCODE_CMD) {
            codec_option = "codec";
        }

        codec = validateBasisCodec(args[codec_option]);
        switch (codec) {
        case BasisCodec::NONE:
            // Not specified
            break;

        case BasisCodec::BasisLZ:
        case BasisCodec::UASTC:
            codecName = to_lower_copy(args[codec_option].as<std::string>());
            break;

        default:
            report.fatal_usage("Invalid encode codec: \"{}\".", args[codec_option].as<std::string>());
            break;
        }

        if (codec == BasisCodec::UASTC) {
            uastc = 1;
        }

        // NOTE: The order of the validation below matters

        if (args[kCLevel].count()) {
            validateBasisLZArg(report, kCLevel);
            compressionLevel = captureCodecOption<uint32_t>(args, kCLevel);;
        }

        if (args[kQLevel].count()) {
            validateBasisLZArg(report, kQLevel);
            qualityLevel = captureCodecOption<uint32_t>(args, kQLevel);
        }

        if (args[kNoEndpointRdo].count()) {
            validateBasisLZArg(report, kNoEndpointRdo);
            captureCodecOption(kNoEndpointRdo);
            noEndpointRDO = 1;
        }

        if (args[kNoSelectorRdo].count()) {
            validateBasisLZArg(report, kNoSelectorRdo);
            captureCodecOption(kNoSelectorRdo);
            noSelectorRDO = 1;
        }

        if (args[kMaxEndpoints].count()) {
            validateBasisLZEndpointRDOArg(report, kMaxEndpoints);
            maxEndpoints = captureCodecOption<uint32_t>(args, kMaxEndpoints);
        }

        if (args[kEndpointRdoThreshold].count()) {
            validateBasisLZEndpointRDOArg(report, kEndpointRdoThreshold);
            endpointRDOThreshold = captureCodecOption<float>(args, kEndpointRdoThreshold);
        }

        if (args[kMaxSelectors].count()) {
            validateBasisLZSelectorRDOArg(report, kMaxSelectors);
            maxSelectors = captureCodecOption<uint32_t>(args, kMaxSelectors);
        }

        if (args[kSelectorRdoThreshold].count()) {
            validateBasisLZSelectorRDOArg(report, kSelectorRdoThreshold);
            selectorRDOThreshold = captureCodecOption<float>(args, kSelectorRdoThreshold);
        }

        if (args[kUastcQuality].count()) {
            validateUASTCArg(report, kUastcQuality);
            uint32_t level = captureCodecOption<uint32_t>(args, kUastcQuality);
            level = std::clamp<uint32_t>(level, 0, KTX_PACK_UASTC_MAX_LEVEL);
            uastcFlags = (unsigned int)~KTX_PACK_UASTC_LEVEL_MASK;
            uastcFlags |= level;
        }

        if (args[kUastcRdo].count()) {
            validateUASTCArg(report, kUastcRdo);
            captureCodecOption(kUastcRdo);
            uastcRDO = 1;
        }

        if (args[kUastcRdoL].count()) {
            validateUASTCRDOArg(report, kUastcRdoL);
            uastcRDOQualityScalar = captureCodecOption<float>(args, kUastcRdoL);
        }

        if (args[kUastcRdoD].count()) {
            validateUASTCRDOArg(report, kUastcRdoD);
            uastcRDODictSize = captureCodecOption<uint32_t>(args, kUastcRdoD);
        }

        if (args[kUastcRdoB].count()) {
            validateUASTCRDOArg(report, kUastcRdoB);
            uastcRDOMaxSmoothBlockErrorScale = captureCodecOption<float>(args, kUastcRdoB);
        }

        if (args[kUastcRdoS].count()) {
            validateUASTCRDOArg(report, kUastcRdoS);
            uastcRDOMaxSmoothBlockStdDev = captureCodecOption<float>(args, kUastcRdoS);
        }

        if (args[kUastcRdoF].count()) {
            validateUASTCRDOArg(report, kUastcRdoF);
            captureCodecOption(kUastcRdoF);
            uastcRDODontFavorSimplerModes = 1;
        }

        if (args[kUastcRdoM].count()) {
            validateUASTCRDOArg(report, kUastcRdoM);
            captureCodecOption(kUastcRdoM);
            uastcRDONoMultithreading = 1;
        }
    }